

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FPathTraverse::PortalRelocate(FPathTraverse *this,DVector2 *displacement,int flags,double hitfrac)

{
  uint uVar1;
  
  uVar1 = this->intercept_index;
  if (intercepts.Count <= uVar1 && uVar1 - intercepts.Count != 0) {
    TArray<intercept_t,_intercept_t>::Grow(&intercepts,uVar1 - intercepts.Count);
  }
  intercepts.Count = uVar1;
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)flags);
  return;
}

Assistant:

void FPathTraverse::PortalRelocate(const DVector2 &displacement, int flags, double hitfrac)
{
	double hitx = trace.x + displacement.X;
	double hity = trace.y + displacement.Y;
	double endx = hitx + trace.dx;
	double endy = hity + trace.dy;
	intercepts.Resize(intercept_index);
	init(hitx, hity, endx, endy, flags, hitfrac);
}